

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O2

string * __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::getSpecializedVSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderInvalidArrayedInputVariablesTest *this)

{
  char *vs_code_raw;
  string vs_code;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_code,
             "${VERSION}\n\nout vec4 data;\n\nvoid main()\n{\n    data = vec4(gl_VertexID, 0, 0, 1);\n}\n"
             ,(allocator<char> *)&vs_code_raw);
  vs_code_raw = vs_code._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (__return_storage_ptr__,&this->super_TestCaseBase,1,&vs_code_raw);
  std::__cxx11::string::~string((string *)&vs_code);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderInvalidArrayedInputVariablesTest::getSpecializedVSCode() const
{
	std::string vs_code = "${VERSION}\n"
						  "\n"
						  "out vec4 data;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    data = vec4(gl_VertexID, 0, 0, 1);\n"
						  "}\n";
	const char* vs_code_raw			= vs_code.c_str();
	std::string specialized_vs_code = specializeShader(1, /* parts */
													   &vs_code_raw);

	return specialized_vs_code;
}